

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<std::pair<QVariant,_QVariant>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  
  local_20._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_20._0_8_ = dbg->stream;
  ((Stream *)local_20._0_8_)->ref = ((Stream *)local_20._0_8_)->ref + 1;
  ::operator<<((Stream *)(local_20 + 8),(pair<QVariant,_QVariant> *)local_20);
  QDebug::~QDebug((QDebug *)(local_20 + 8));
  QDebug::~QDebug((QDebug *)local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20._16_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }